

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O1

int __thiscall ot::commissioner::MockSocket::Send(MockSocket *this,uint8_t *aBuf,size_t aLen)

{
  element_type *peVar1;
  
  if ((this->super_Socket).mIsConnected != false) {
    peVar1 = (this->mPeerSocket).
             super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&peVar1->mRecvBuf,
               (peVar1->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,aBuf,aBuf + aLen);
    event_active(&(((this->mPeerSocket).
                    super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_Socket).mEvent,2,0);
    return (int)aLen;
  }
  abort();
}

Assistant:

int MockSocket::Send(const uint8_t *aBuf, size_t aLen)
{
    VerifyOrDie(IsConnected());

    auto &peerRecvBuf = mPeerSocket->mRecvBuf;

    peerRecvBuf.insert(peerRecvBuf.end(), aBuf, aBuf + aLen);
    event_active(&mPeerSocket->mEvent, EV_READ, 0);

    return static_cast<int>(aLen);
}